

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O0

void Assimp::ExportSceneGLB
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *pProperties)

{
  undefined1 local_a0 [8];
  glTFExporter exporter;
  ExportProperties *pProperties_local;
  aiScene *pScene_local;
  IOSystem *pIOSystem_local;
  char *pFile_local;
  
  exporter.mBodyData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pProperties;
  glTFExporter::glTFExporter((glTFExporter *)local_a0,pFile,pIOSystem,pScene,pProperties,true);
  glTFExporter::~glTFExporter((glTFExporter *)local_a0);
  return;
}

Assistant:

void ExportSceneGLB(const char* pFile, IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* pProperties)
    {
        // invoke the exporter
        glTFExporter exporter(pFile, pIOSystem, pScene, pProperties, true);
    }